

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void __thiscall
duckdb::RLECompressState<unsigned_long,_false>::Append
          (RLECompressState<unsigned_long,_false> *this,UnifiedVectorFormat *vdata,idx_t count)

{
  ValidityMask *validity;
  unsigned_long *in_RDX;
  UnifiedVectorFormat *in_RSI;
  idx_t idx;
  idx_t i;
  unsigned_long *data;
  unsigned_long *idx_00;
  
  validity = (ValidityMask *)UnifiedVectorFormat::GetData<unsigned_long>(in_RSI);
  for (idx_00 = (unsigned_long *)0x0; idx_00 < in_RDX; idx_00 = (unsigned_long *)((long)idx_00 + 1))
  {
    SelectionVector::get_index(in_RSI->sel,(idx_t)idx_00);
    RLEState<unsigned_long>::Update<duckdb::RLECompressState<unsigned_long,false>::RLEWriter>
              ((RLEState<unsigned_long> *)in_RSI,in_RDX,validity,(idx_t)idx_00);
  }
  return;
}

Assistant:

void Append(UnifiedVectorFormat &vdata, idx_t count) {
		auto data = UnifiedVectorFormat::GetData<T>(vdata);
		for (idx_t i = 0; i < count; i++) {
			auto idx = vdata.sel->get_index(i);
			state.template Update<RLECompressState<T, WRITE_STATISTICS>::RLEWriter>(data, vdata.validity, idx);
		}
	}